

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QStringList * QDir::searchPaths(QStringList *__return_storage_ptr__,QString *prefix)

{
  Type *pTVar1;
  long in_FS_OFFSET;
  QReadLocker local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>::guard._q_value.
      super___atomic_base<signed_char>._M_i == -1) {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>::
             operator*((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>
                        *)__return_storage_ptr__);
    local_30.q_val = (quintptr)pTVar1;
    QReadLocker::relock(&local_30);
    QHash<QString,_QList<QString>_>::value(__return_storage_ptr__,&pTVar1->paths,prefix);
    QReadLocker::~QReadLocker(&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_00212da4;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_00212da4:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QDir::searchPaths(const QString &prefix)
{
    if (!dirSearchPaths.exists())
        return QStringList();

    const DirSearchPaths &conf = *dirSearchPaths;
    const QReadLocker lock(&conf.mutex);
    return conf.paths.value(prefix);
}